

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

void __thiscall icu_63::ICUService::clearCaches(ICUService *this)

{
  DNCache *this_00;
  UHashtable *hash;
  Hashtable *pHVar1;
  void *in_RSI;
  
  this->timestamp = this->timestamp + 1;
  this_00 = this->dnCache;
  if (this_00 != (DNCache *)0x0) {
    Locale::~Locale(&this_00->locale);
    hash = (this_00->cache).hash;
    if (hash != (UHashtable *)0x0) {
      uhash_close_63(hash);
    }
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  this->dnCache = (DNCache *)0x0;
  pHVar1 = this->idCache;
  if (pHVar1 != (Hashtable *)0x0) {
    if (pHVar1->hash != (UHashtable *)0x0) {
      uhash_close_63(pHVar1->hash);
    }
    UMemory::operator_delete((UMemory *)pHVar1,in_RSI);
  }
  this->idCache = (Hashtable *)0x0;
  pHVar1 = this->serviceCache;
  if (pHVar1 != (Hashtable *)0x0) {
    if (pHVar1->hash != (UHashtable *)0x0) {
      uhash_close_63(pHVar1->hash);
    }
    UMemory::operator_delete((UMemory *)pHVar1,in_RSI);
  }
  this->serviceCache = (Hashtable *)0x0;
  return;
}

Assistant:

void 
ICUService::clearCaches() 
{
    // callers synchronize before use
    ++timestamp;
    delete dnCache;
    dnCache = NULL;
    delete idCache;
    idCache = NULL;
    delete serviceCache; serviceCache = NULL;
}